

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_uncompressed_block(stbi__zbuf *a)

{
  stbi_uc sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long *in_RDI;
  int k;
  int nlen;
  int len;
  stbi_uc header [4];
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(uint *)(in_RDI + 2) & 7) != 0) {
    stbi__zreceive((stbi__zbuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
  }
  iVar2 = 0;
  while (0 < (int)in_RDI[2]) {
    (&stack0xffffffffffffffec)[iVar2] = (char)(int)in_RDI[3];
    *(uint *)(in_RDI + 3) = *(uint *)(in_RDI + 3) >> 8;
    *(int *)(in_RDI + 2) = (int)in_RDI[2] + -8;
    iVar2 = iVar2 + 1;
  }
  if ((int)in_RDI[2] < 0) {
    iVar2 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffe4,iVar2));
  }
  else {
    for (; iVar2 < 4; iVar2 = iVar2 + 1) {
      sVar1 = stbi__zget8((stbi__zbuf *)CONCAT44(in_stack_ffffffffffffffe4,iVar2));
      (&stack0xffffffffffffffec)[iVar2] = sVar1;
    }
    uVar3 = (in_stack_ffffffffffffffec >> 8 & 0xff) * 0x100 + (in_stack_ffffffffffffffec & 0xff);
    uVar4 = (in_stack_ffffffffffffffec >> 0x18) * 0x100 + (in_stack_ffffffffffffffec >> 0x10 & 0xff)
    ;
    if (uVar4 == (uVar3 ^ 0xffff)) {
      if ((ulong)in_RDI[1] < (ulong)(*in_RDI + (long)(int)uVar3)) {
        iVar2 = stbi__err((char *)CONCAT44(uVar4,iVar2));
      }
      else if (((ulong)in_RDI[6] < (ulong)(in_RDI[4] + (long)(int)uVar3)) &&
              (iVar2 = stbi__zexpand((stbi__zbuf *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     (char *)in_RDI,in_stack_ffffffffffffffec), iVar2 == 0)) {
        iVar2 = 0;
      }
      else {
        memcpy((void *)in_RDI[4],(void *)*in_RDI,(long)(int)uVar3);
        *in_RDI = *in_RDI + (long)(int)uVar3;
        in_RDI[4] = in_RDI[4] + (long)(int)uVar3;
        iVar2 = 1;
      }
    }
    else {
      iVar2 = stbi__err((char *)CONCAT44(uVar4,iVar2));
    }
  }
  return iVar2;
}

Assistant:

static int stbi__parse_uncompressed_block(stbi__zbuf *a)
{
   stbi_uc header[4];
   int len,nlen,k;
   if (a->num_bits & 7)
      stbi__zreceive(a, a->num_bits & 7); // discard
   // drain the bit-packed data into header
   k = 0;
   while (a->num_bits > 0) {
      header[k++] = (stbi_uc) (a->code_buffer & 255); // suppress MSVC run-time check
      a->code_buffer >>= 8;
      a->num_bits -= 8;
   }
   if (a->num_bits < 0) return stbi__err("zlib corrupt","Corrupt PNG");
   // now fill header the normal way
   while (k < 4)
      header[k++] = stbi__zget8(a);
   len  = header[1] * 256 + header[0];
   nlen = header[3] * 256 + header[2];
   if (nlen != (len ^ 0xffff)) return stbi__err("zlib corrupt","Corrupt PNG");
   if (a->zbuffer + len > a->zbuffer_end) return stbi__err("read past buffer","Corrupt PNG");
   if (a->zout + len > a->zout_end)
      if (!stbi__zexpand(a, a->zout, len)) return 0;
   memcpy(a->zout, a->zbuffer, len);
   a->zbuffer += len;
   a->zout += len;
   return 1;
}